

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O2

_Bool malloc_mutex_trylock(tsdn_t *tsdn,malloc_mutex_t *mutex)

{
  _Bool _Var1;
  
  _Var1 = malloc_mutex_trylock_final(mutex);
  if (!_Var1) {
    mutex_owner_stats_update(tsdn,mutex);
  }
  return _Var1;
}

Assistant:

static inline bool
malloc_mutex_trylock(tsdn_t *tsdn, malloc_mutex_t *mutex) {
	witness_assert_not_owner(tsdn_witness_tsdp_get(tsdn), &mutex->witness);
	if (isthreaded) {
		if (malloc_mutex_trylock_final(mutex)) {
			return true;
		}
		mutex_owner_stats_update(tsdn, mutex);
	}
	witness_lock(tsdn_witness_tsdp_get(tsdn), &mutex->witness);

	return false;
}